

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

void poll_cb(uv_fs_t *req)

{
  uv_handle_t *handle_00;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uv_stat_t *b;
  ulong uVar4;
  uint64_t uVar5;
  uv_fs_poll_t *handle;
  uint64_t interval;
  poll_ctx *ctx;
  uv_stat_t *statbuf;
  uv_fs_t *req_local;
  
  handle_00 = *(uv_handle_t **)&req[-1].mode;
  iVar3 = uv_is_active(handle_00);
  if ((iVar3 != 0) && ((handle_00->flags & 3) == 0)) {
    if (req->result == 0) {
      b = &req->statbuf;
      if ((*(int *)&req[-1].bufs != 0) &&
         ((*(int *)&req[-1].bufs < 0 || (iVar3 = statbuf_eq((uv_stat_t *)(req + 1),b), iVar3 == 0)))
         ) {
        uVar2._0_4_ = req[-1].mode;
        uVar2._4_4_ = req[-1].nbufs;
        (*(code *)req[-1].btime)(uVar2,0,req + 1,b);
      }
      memcpy(req + 1,b,0xa0);
      *(undefined4 *)&req[-1].bufs = 1;
    }
    else if ((long)*(int *)&req[-1].bufs != req->result) {
      uVar1._0_4_ = req[-1].mode;
      uVar1._4_4_ = req[-1].nbufs;
      (*(code *)req[-1].btime)(uVar1,req->result & 0xffffffff,req + 1,&zero_statbuf);
      *(int *)&req[-1].bufs = (int)req->result;
    }
  }
  uv_fs_req_cleanup(req);
  iVar3 = uv_is_active(handle_00);
  if ((iVar3 == 0) || ((handle_00->flags & 3) != 0)) {
    uv_close((uv_handle_t *)&req[-1].atime,timer_close_cb);
  }
  else {
    uVar4 = (ulong)*(uint *)((long)&req[-1].bufs + 4);
    uVar5 = uv_now(*(uv_loop_t **)&req[-1].uid);
    iVar3 = uv_timer_start((uv_timer_t *)&req[-1].atime,timer_cb,
                           uVar4 - (uVar5 - req[-1].off) % uVar4,0);
    if (iVar3 != 0) {
      abort();
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_t* req) {
  uv_stat_t* statbuf;
  struct poll_ctx* ctx;
  uint64_t interval;
  uv_fs_poll_t* handle;

  ctx = container_of(req, struct poll_ctx, fs_req);
  handle = ctx->parent_handle;

  if (!uv_is_active((uv_handle_t*)handle) || uv__is_closing(handle))
    goto out;

  if (req->result != 0) {
    if (ctx->busy_polling != req->result) {
      ctx->poll_cb(ctx->parent_handle,
                   req->result,
                   &ctx->statbuf,
                   &zero_statbuf);
      ctx->busy_polling = req->result;
    }
    goto out;
  }

  statbuf = &req->statbuf;

  if (ctx->busy_polling != 0)
    if (ctx->busy_polling < 0 || !statbuf_eq(&ctx->statbuf, statbuf))
      ctx->poll_cb(ctx->parent_handle, 0, &ctx->statbuf, statbuf);

  ctx->statbuf = *statbuf;
  ctx->busy_polling = 1;

out:
  uv_fs_req_cleanup(req);

  if (!uv_is_active((uv_handle_t*)handle) || uv__is_closing(handle)) {
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    return;
  }

  /* Reschedule timer, subtract the delay from doing the stat(). */
  interval = ctx->interval;
  interval -= (uv_now(ctx->loop) - ctx->start_time) % interval;

  if (uv_timer_start(&ctx->timer_handle, timer_cb, interval, 0))
    abort();
}